

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_layer_interface.cpp
# Opt level: O0

XrResult ApiLayerInterface::LoadApiLayers
                   (string *openxr_command,uint32_t enabled_api_layer_count,
                   char **enabled_api_layer_names,
                   vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                   *api_layer_interfaces)

{
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *this;
  pointer *this_00;
  bool bVar1;
  __type _Var2;
  bool bVar3;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __result;
  reference __x;
  size_type sVar4;
  reference puVar5;
  pointer pAVar6;
  string *psVar7;
  char *pcVar8;
  code *pcVar9;
  ostream *poVar10;
  undefined8 uVar11;
  size_type __n;
  ApiLayerInterface *this_01;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar12;
  ApiLayerInterface *local_9b0;
  reference local_9a8;
  XrExtensionProperties *ext_prop;
  iterator __end2_1;
  iterator __begin2_1;
  vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *__range2_1;
  vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> extension_properties;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  supported_extensions;
  string local_940;
  ostringstream local_920 [8];
  ostringstream oss_2;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_7a8;
  string local_790;
  ostringstream local_770 [8];
  ostringstream oss_1;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_5f8;
  allocator local_5d1;
  undefined1 local_5d0 [8];
  string warning_message_1;
  undefined8 uStack_5a8;
  XrResult res;
  XrNegotiateApiLayerRequest api_layer_info;
  XrNegotiateLoaderInfo loader_info;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_548;
  string local_530;
  ostringstream local_510 [8];
  ostringstream oss;
  PFN_xrNegotiateLoaderApiLayerInterface negotiate;
  string local_388;
  undefined1 local_368 [8];
  string function_name;
  allocator local_329;
  undefined1 local_328 [8];
  string warning_message;
  string local_300 [8];
  string library_message;
  LoaderPlatformLibraryHandle layer_library;
  unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_> *manifest_file;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  *__range1_1;
  pointer pXStack_2b0;
  pointer local_2a8;
  allocator local_299;
  undefined1 local_298 [8];
  string error_message;
  const_iterator local_270;
  unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_> *local_268;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_260;
  undefined1 local_258;
  byte local_249;
  iterator iStack_248;
  bool erased_layer_manifest_file;
  __normal_iterator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_*,_std::vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>_>
  local_240;
  iterator it;
  bool found_this_layer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *layer_name;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_1f8;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_188;
  allocator local_161;
  string local_160;
  allocator local_139;
  string local_138;
  undefined1 auStack_118 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabled_explicit_api_layer_names;
  undefined1 local_f8 [7];
  bool found_all_layers;
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  explicit_layer_manifest_files;
  unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
  *enabled_layer_manifest_file;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  *__range1;
  XrResult local_9c;
  undefined1 auStack_98 [4];
  XrResult result;
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  enabled_layer_manifest_files_in_init_order;
  undefined1 local_70 [7];
  bool any_loaded;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layers_already_found;
  XrResult last_error;
  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  *api_layer_interfaces_local;
  char **enabled_api_layer_names_local;
  uint32_t enabled_api_layer_count_local;
  string *openxr_command_local;
  
  layers_already_found._M_h._M_single_bucket._4_4_ = XR_SUCCESS;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_70);
  bVar3 = false;
  _auStack_98 = (pointer)0x0;
  enabled_layer_manifest_files_in_init_order.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  enabled_layer_manifest_files_in_init_order.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ::vector((vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
            *)auStack_98);
  local_9c = ApiLayerManifestFile::FindManifestFiles
                       (openxr_command,MANIFEST_TYPE_IMPLICIT_API_LAYER,
                        (vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                         *)auStack_98);
  __end1 = std::
           vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
           ::begin((vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                    *)auStack_98);
  enabled_layer_manifest_file =
       (unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_> *)
       std::
       vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
       ::end((vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
              *)auStack_98);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_*,_std::vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>_>
                                     *)&enabled_layer_manifest_file), bVar1) {
    puVar5 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_*,_std::vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>_>
             ::operator*(&__end1);
    pAVar6 = std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>::
             operator->(puVar5);
    psVar7 = ApiLayerManifestFile::LayerName_abi_cxx11_(pAVar6);
    pVar12 = std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_70,psVar7);
    explicit_layer_manifest_files.
    super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)pVar12.first.
                  super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ._M_cur;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_*,_std::vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>_>
    ::operator++(&__end1);
  }
  memset(local_f8,0,0x18);
  std::
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ::vector((vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
            *)local_f8);
  if (XR_ERROR_VALIDATION_FAILURE < local_9c) {
    local_9c = ApiLayerManifestFile::FindManifestFiles
                         (openxr_command,MANIFEST_TYPE_EXPLICIT_API_LAYER,
                          (vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                           *)local_f8);
  }
  enabled_explicit_api_layer_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  if (XR_ERROR_VALIDATION_FAILURE < local_9c) {
    auStack_118 = (undefined1  [8])0x0;
    enabled_explicit_api_layer_names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    enabled_explicit_api_layer_names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)auStack_118);
    AddEnvironmentApiLayers
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)auStack_118);
    if (enabled_api_layer_count == 0) {
LAB_00108953:
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)auStack_118);
      layer_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_118);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&layer_name), bVar1) {
        __x = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end2);
        it._M_current._7_1_ = 0;
        sVar4 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_70,__x);
        if (sVar4 == 0) {
          local_240._M_current =
               (unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_> *)
               std::
               vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
               ::begin((vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                        *)local_f8);
          while( true ) {
            iStack_248 = std::
                         vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                         ::end((vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                                *)local_f8);
            bVar1 = __gnu_cxx::operator!=(&local_240,&stack0xfffffffffffffdb8);
            if (!bVar1) break;
            local_249 = 0;
            puVar5 = __gnu_cxx::
                     __normal_iterator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_*,_std::vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>_>
                     ::operator*(&local_240);
            pAVar6 = std::
                     unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>::
                     operator->(puVar5);
            psVar7 = ApiLayerManifestFile::LayerName_abi_cxx11_(pAVar6);
            _Var2 = std::operator==(__x,psVar7);
            if (_Var2) {
              it._M_current._7_1_ = 1;
              pVar12 = std::
                       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_70,__x);
              local_260._M_cur =
                   (__node_type *)
                   pVar12.first.
                   super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ._M_cur;
              local_258 = pVar12.second;
              puVar5 = __gnu_cxx::
                       __normal_iterator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_*,_std::vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>_>
                       ::operator*(&local_240);
              std::
              vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
              ::push_back((vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                           *)auStack_98,puVar5);
              __gnu_cxx::
              __normal_iterator<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>const*,std::vector<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>,std::allocator<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>>>>
              ::
              __normal_iterator<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>*>
                        ((__normal_iterator<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>const*,std::vector<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>,std::allocator<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>>>>
                          *)&local_270,&local_240);
              local_268 = (unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                           *)std::
                             vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                             ::erase((vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                                      *)local_f8,local_270);
              local_249 = 1;
              local_240._M_current = local_268;
            }
            if ((local_249 & 1) == 0) {
              error_message.field_2._8_8_ =
                   __gnu_cxx::
                   __normal_iterator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_*,_std::vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>_>
                   ::operator++(&local_240,0);
            }
          }
        }
        else {
          it._M_current._7_1_ = 1;
        }
        if ((it._M_current._7_1_ & 1) == 0) {
          enabled_explicit_api_layer_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_298,"ApiLayerInterface::LoadApiLayers - failed to find layer ",
                     &local_299);
          std::allocator<char>::~allocator((allocator<char> *)&local_299);
          std::__cxx11::string::operator+=((string *)local_298,(string *)__x);
          __range1_1 = (vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                        *)0x0;
          pXStack_2b0 = (pointer)0x0;
          local_2a8 = (pointer)0x0;
          std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector
                    ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&__range1_1)
          ;
          LoaderLogger::LogErrorMessage
                    (openxr_command,(string *)local_298,
                     (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&__range1_1)
          ;
          std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                    ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&__range1_1)
          ;
          std::__cxx11::string::~string((string *)local_298);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      bVar1 = false;
    }
    else {
      if (enabled_api_layer_names != (char **)0x0) {
        __result = std::
                   back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                             ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)auStack_118);
        std::
        copy<char_const*const*,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (enabled_api_layer_names,enabled_api_layer_names + enabled_api_layer_count,
                   __result);
        goto LAB_00108953;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_138,"xrCreateInstance",&local_139);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_160,
                 "VUID-XrInstanceCreateInfo-enabledApiLayerNames-parameter: enabledApiLayerCount is non-0 but array is NULL"
                 ,&local_161);
      local_188.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_188);
      LoaderLogger::LogErrorMessage(&local_138,&local_160,&local_188);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_188);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1a8,"xrCreateInstance",&local_1a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1d0,
                 "VUID-xrCreateInstance-info-parameter: something wrong with XrInstanceCreateInfo contents"
                 ,&local_1d1);
      local_1f8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1f8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_1f8);
      LoaderLogger::LogErrorMessage(&local_1a8,&local_1d0,&local_1f8);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_1f8);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
      openxr_command_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      bVar1 = true;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_118);
    if (bVar1) goto LAB_00109ae4;
  }
  __end1_1 = std::
             vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
             ::begin((vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                      *)auStack_98);
  manifest_file =
       (unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_> *)
       std::
       vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
       ::end((vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
              *)auStack_98);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_*,_std::vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>_>
                             *)&manifest_file), bVar1) {
    puVar5 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_*,_std::vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>_>
             ::operator*(&__end1_1);
    pAVar6 = std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>::
             operator->(puVar5);
    psVar7 = ManifestFile::LibraryPath_abi_cxx11_(&pAVar6->super_ManifestFile);
    library_message.field_2._8_8_ = LoaderPlatformLibraryOpen(psVar7);
    if ((LoaderPlatformLibraryHandle)library_message.field_2._8_8_ ==
        (LoaderPlatformLibraryHandle)0x0) {
      if (!bVar3) {
        layers_already_found._M_h._M_single_bucket._4_4_ = XR_ERROR_FILE_ACCESS_ERROR;
      }
      pAVar6 = std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>::
               operator->(puVar5);
      psVar7 = ManifestFile::LibraryPath_abi_cxx11_(&pAVar6->super_ManifestFile);
      pcVar8 = LoaderPlatformLibraryOpenError(psVar7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_300,pcVar8,(allocator *)(warning_message.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator
                ((allocator<char> *)(warning_message.field_2._M_local_buf + 0xf));
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_328,"ApiLayerInterface::LoadApiLayers skipping layer ",&local_329);
      std::allocator<char>::~allocator((allocator<char> *)&local_329);
      pAVar6 = std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>::
               operator->(puVar5);
      psVar7 = ApiLayerManifestFile::LayerName_abi_cxx11_(pAVar6);
      std::__cxx11::string::operator+=((string *)local_328,(string *)psVar7);
      std::__cxx11::string::operator+=((string *)local_328,", failed to load with message \"");
      std::__cxx11::string::operator+=((string *)local_328,local_300);
      std::__cxx11::string::operator+=((string *)local_328,"\"");
      function_name.field_2._8_8_ = 0;
      this = (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
             ((long)&function_name.field_2 + 8);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(this);
      LoaderLogger::LogWarningMessage(openxr_command,(string *)local_328,this);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                 ((long)&function_name.field_2 + 8));
      std::__cxx11::string::~string((string *)local_328);
      std::__cxx11::string::~string(local_300);
    }
    else {
      pAVar6 = std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>::
               operator->(puVar5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_388,"xrNegotiateLoaderApiLayerInterface",
                 (allocator *)((long)&negotiate + 7));
      psVar7 = ManifestFile::GetFunctionName(&pAVar6->super_ManifestFile,&local_388);
      std::__cxx11::string::string((string *)local_368,(string *)psVar7);
      std::__cxx11::string::~string((string *)&local_388);
      std::allocator<char>::~allocator((allocator<char> *)((long)&negotiate + 7));
      pcVar9 = (code *)LoaderPlatformLibraryGetProcAddr
                                 ((LoaderPlatformLibraryHandle)library_message.field_2._8_8_,
                                  (string *)local_368);
      if (pcVar9 == (code *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_510);
        poVar10 = std::operator<<((ostream *)local_510,
                                  "ApiLayerInterface::LoadApiLayers skipping layer ");
        pAVar6 = std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>::
                 operator->(puVar5);
        psVar7 = ApiLayerManifestFile::LayerName_abi_cxx11_(pAVar6);
        poVar10 = std::operator<<(poVar10,(string *)psVar7);
        poVar10 = std::operator<<(poVar10," because negotiation function ");
        poVar10 = std::operator<<(poVar10,(string *)local_368);
        std::operator<<(poVar10," was not found");
        std::__cxx11::ostringstream::str();
        local_548.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_548.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_548.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_548);
        LoaderLogger::LogErrorMessage(openxr_command,&local_530,&local_548);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_548);
        std::__cxx11::string::~string((string *)&local_530);
        LoaderPlatformLibraryClose((LoaderPlatformLibraryHandle)library_message.field_2._8_8_);
        layers_already_found._M_h._M_single_bucket._4_4_ = XR_ERROR_API_LAYER_NOT_PRESENT;
        std::__cxx11::ostringstream::~ostringstream(local_510);
      }
      else {
        api_layer_info.createApiLayerInstance = (PFN_xrCreateApiLayerInstance)0x100000001;
        api_layer_info.layerApiVersion = 0;
        api_layer_info.getInstanceProcAddr = (PFN_xrGetInstanceProcAddr)0x0;
        api_layer_info.structSize = 0;
        api_layer_info.layerInterfaceVersion = 0;
        api_layer_info._20_4_ = 0;
        uStack_5a8 = 0x100000002;
        api_layer_info.structType = 0x30;
        api_layer_info.structVersion = 0;
        pAVar6 = std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>::
                 operator->(puVar5);
        ApiLayerManifestFile::LayerName_abi_cxx11_(pAVar6);
        uVar11 = std::__cxx11::string::c_str();
        warning_message_1.field_2._12_4_ =
             (*pcVar9)(&api_layer_info.createApiLayerInstance,uVar11,&stack0xfffffffffffffa58);
        if ((-1 < (int)warning_message_1.field_2._12_4_) && (api_layer_info.layerApiVersion == 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_5d0,"ApiLayerInterface::LoadApiLayers skipping layer ",
                     &local_5d1);
          std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
          pAVar6 = std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                   ::operator->(puVar5);
          psVar7 = ApiLayerManifestFile::LayerName_abi_cxx11_(pAVar6);
          std::__cxx11::string::operator+=((string *)local_5d0,(string *)psVar7);
          std::__cxx11::string::operator+=
                    ((string *)local_5d0,", negotiation did not return a valid getInstanceProcAddr")
          ;
          local_5f8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_5f8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_5f8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_5f8);
          LoaderLogger::LogWarningMessage(openxr_command,(string *)local_5d0,&local_5f8);
          std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_5f8);
          warning_message_1.field_2._12_4_ = 0xffffffdf;
          std::__cxx11::string::~string((string *)local_5d0);
        }
        if ((int)warning_message_1.field_2._12_4_ < 0) {
          if (!bVar3) {
            layers_already_found._M_h._M_single_bucket._4_4_ = warning_message_1.field_2._12_4_;
          }
          std::__cxx11::ostringstream::ostringstream(local_770);
          poVar10 = std::operator<<((ostream *)local_770,
                                    "ApiLayerInterface::LoadApiLayers skipping layer ");
          pAVar6 = std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                   ::operator->(puVar5);
          psVar7 = ApiLayerManifestFile::LayerName_abi_cxx11_(pAVar6);
          poVar10 = std::operator<<(poVar10,(string *)psVar7);
          poVar10 = std::operator<<(poVar10," due to failed negotiation with error ");
          std::ostream::operator<<(poVar10,warning_message_1.field_2._12_4_);
          std::__cxx11::ostringstream::str();
          local_7a8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_7a8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_7a8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_7a8);
          LoaderLogger::LogWarningMessage(openxr_command,&local_790,&local_7a8);
          std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_7a8);
          std::__cxx11::string::~string((string *)&local_790);
          LoaderPlatformLibraryClose((LoaderPlatformLibraryHandle)library_message.field_2._8_8_);
          std::__cxx11::ostringstream::~ostringstream(local_770);
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_920);
          poVar10 = std::operator<<((ostream *)local_920,
                                    "ApiLayerInterface::LoadApiLayers succeeded loading layer ");
          pAVar6 = std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                   ::operator->(puVar5);
          psVar7 = ApiLayerManifestFile::LayerName_abi_cxx11_(pAVar6);
          poVar10 = std::operator<<(poVar10,(string *)psVar7);
          poVar10 = std::operator<<(poVar10," using interface version ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,(uint)api_layer_info.structSize);
          poVar10 = std::operator<<(poVar10," and OpenXR API version ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,api_layer_info._22_2_);
          poVar10 = std::operator<<(poVar10,".");
          std::ostream::operator<<(poVar10,api_layer_info._20_2_);
          std::__cxx11::ostringstream::str();
          supported_extensions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          this_00 = &supported_extensions.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector
                    ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)this_00);
          LoaderLogger::LogInfoMessage
                    (openxr_command,&local_940,
                     (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)this_00);
          std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                    ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                     &supported_extensions.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string((string *)&local_940);
          std::__cxx11::ostringstream::~ostringstream(local_920);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&extension_properties.
                       super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::vector
                    ((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)
                     &__range2_1);
          pAVar6 = std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                   ::operator->(puVar5);
          ManifestFile::GetInstanceExtensionProperties
                    (&pAVar6->super_ManifestFile,
                     (vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)
                     &__range2_1);
          __n = std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::size
                          ((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)
                           &__range2_1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&extension_properties.
                        super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,__n);
          __end2_1 = std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::
                     begin((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)
                           &__range2_1);
          ext_prop = (XrExtensionProperties *)
                     std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::end
                               ((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                                 *)&__range2_1);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end2_1,
                                    (__normal_iterator<XrExtensionProperties_*,_std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>_>
                                     *)&ext_prop), bVar3) {
            local_9a8 = __gnu_cxx::
                        __normal_iterator<XrExtensionProperties_*,_std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>_>
                        ::operator*(&__end2_1);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char(&)[128]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &extension_properties.
                        super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_9a8->extensionName
                      );
            __gnu_cxx::
            __normal_iterator<XrExtensionProperties_*,_std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>_>
            ::operator++(&__end2_1);
          }
          this_01 = (ApiLayerInterface *)operator_new(0x58);
          pAVar6 = std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                   ::operator->(puVar5);
          psVar7 = ApiLayerManifestFile::LayerName_abi_cxx11_(pAVar6);
          ApiLayerInterface(this_01,psVar7,
                            (LoaderPlatformLibraryHandle)library_message.field_2._8_8_,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&extension_properties.
                                super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (PFN_xrGetInstanceProcAddr)api_layer_info.layerApiVersion,
                            (PFN_xrCreateApiLayerInstance)api_layer_info.getInstanceProcAddr);
          local_9b0 = this_01;
          std::
          vector<std::unique_ptr<ApiLayerInterface,std::default_delete<ApiLayerInterface>>,std::allocator<std::unique_ptr<ApiLayerInterface,std::default_delete<ApiLayerInterface>>>>
          ::emplace_back<ApiLayerInterface*>
                    ((vector<std::unique_ptr<ApiLayerInterface,std::default_delete<ApiLayerInterface>>,std::allocator<std::unique_ptr<ApiLayerInterface,std::default_delete<ApiLayerInterface>>>>
                      *)api_layer_interfaces,&local_9b0);
          bVar3 = true;
          layers_already_found._M_h._M_single_bucket._4_4_ = XR_SUCCESS;
          std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::~vector
                    ((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)
                     &__range2_1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&extension_properties.
                        super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      std::__cxx11::string::~string((string *)local_368);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_*,_std::vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>_>
    ::operator++(&__end1_1);
  }
  if ((enabled_explicit_api_layer_names.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    layers_already_found._M_h._M_single_bucket._4_4_ = XR_ERROR_API_LAYER_NOT_PRESENT;
  }
  if (layers_already_found._M_h._M_single_bucket._4_4_ < XR_SUCCESS) {
    std::
    vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    ::clear(api_layer_interfaces);
  }
  openxr_command_local._4_4_ = layers_already_found._M_h._M_single_bucket._4_4_;
LAB_00109ae4:
  std::
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ::~vector((vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
             *)local_f8);
  std::
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ::~vector((vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
             *)auStack_98);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70);
  return openxr_command_local._4_4_;
}

Assistant:

XrResult ApiLayerInterface::LoadApiLayers(const std::string& openxr_command, uint32_t enabled_api_layer_count,
                                          const char* const* enabled_api_layer_names,
                                          std::vector<std::unique_ptr<ApiLayerInterface>>& api_layer_interfaces) {
    XrResult last_error = XR_SUCCESS;
    std::unordered_set<std::string> layers_already_found;

    bool any_loaded = false;
    std::vector<std::unique_ptr<ApiLayerManifestFile>> enabled_layer_manifest_files_in_init_order = {};

    // Find any implicit layers.
    XrResult result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_IMPLICIT_API_LAYER,
                                                              enabled_layer_manifest_files_in_init_order);

    for (const auto& enabled_layer_manifest_file : enabled_layer_manifest_files_in_init_order) {
        layers_already_found.insert(enabled_layer_manifest_file->LayerName());
    }

    // Find any explicit layers.
    std::vector<std::unique_ptr<ApiLayerManifestFile>> explicit_layer_manifest_files = {};

    if (XR_SUCCEEDED(result)) {
        result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_EXPLICIT_API_LAYER,
                                                         explicit_layer_manifest_files);
    }

    bool found_all_layers = true;

    if (XR_SUCCEEDED(result)) {
        // Put all explicit and then xrCreateInstance enabled layers into a string vector

        std::vector<std::string> enabled_explicit_api_layer_names = {};

        AddEnvironmentApiLayers(enabled_explicit_api_layer_names);

        if (enabled_api_layer_count > 0) {
            if (nullptr == enabled_api_layer_names) {
                LoaderLogger::LogErrorMessage(
                    "xrCreateInstance",
                    "VUID-XrInstanceCreateInfo-enabledApiLayerNames-parameter: enabledApiLayerCount is non-0 but array is NULL");
                LoaderLogger::LogErrorMessage(
                    "xrCreateInstance", "VUID-xrCreateInstance-info-parameter: something wrong with XrInstanceCreateInfo contents");
                return XR_ERROR_VALIDATION_FAILURE;
            }

            std::copy(enabled_api_layer_names, enabled_api_layer_names + enabled_api_layer_count,
                      std::back_inserter(enabled_explicit_api_layer_names));
        }

        // add explicit layers to list of layers to enable
        for (const auto& layer_name : enabled_explicit_api_layer_names) {
            bool found_this_layer = false;

            if (layers_already_found.count(layer_name) > 0) {
                found_this_layer = true;
            } else {
                for (auto it = explicit_layer_manifest_files.begin(); it != explicit_layer_manifest_files.end();) {
                    bool erased_layer_manifest_file = false;

                    if (layer_name == (*it)->LayerName()) {
                        found_this_layer = true;
                        layers_already_found.insert(layer_name);
                        enabled_layer_manifest_files_in_init_order.push_back(std::move(*it));
                        it = explicit_layer_manifest_files.erase(it);
                        erased_layer_manifest_file = true;
                    }

                    if (!erased_layer_manifest_file) {
                        it++;
                    }
                }
            }

            // If even one of the layers wasn't found, we want to return an error
            if (!found_this_layer) {
                found_all_layers = false;
                std::string error_message = "ApiLayerInterface::LoadApiLayers - failed to find layer ";
                error_message += layer_name;
                LoaderLogger::LogErrorMessage(openxr_command, error_message);
            }
        }
    }

    for (std::unique_ptr<ApiLayerManifestFile>& manifest_file : enabled_layer_manifest_files_in_init_order) {
        LoaderPlatformLibraryHandle layer_library = LoaderPlatformLibraryOpen(manifest_file->LibraryPath());
        if (nullptr == layer_library) {
            if (!any_loaded) {
                last_error = XR_ERROR_FILE_ACCESS_ERROR;
            }
            std::string library_message = LoaderPlatformLibraryOpenError(manifest_file->LibraryPath());
            std::string warning_message = "ApiLayerInterface::LoadApiLayers skipping layer ";
            warning_message += manifest_file->LayerName();
            warning_message += ", failed to load with message \"";
            warning_message += library_message;
            warning_message += "\"";
            LoaderLogger::LogWarningMessage(openxr_command, warning_message);
            continue;
        }
#ifdef XR_KHR_LOADER_INIT_SUPPORT
        if (!LoaderInitData::instance().initialized()) {
            LoaderLogger::LogErrorMessage(openxr_command, "ApiLayerInterface::LoadApiLayers skipping manifest file " +
                                                              manifest_file->Filename() +
                                                              " because xrInitializeLoaderKHR was not yet called.");

            LoaderPlatformLibraryClose(layer_library);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        bool forwardedInitLoader = false;
        {
            // If we have xrInitializeLoaderKHR exposed as an export, forward call to it.
            const auto function_name = manifest_file->GetFunctionName("xrInitializeLoaderKHR");
            auto initLoader =
                reinterpret_cast<PFN_xrInitializeLoaderKHR>(LoaderPlatformLibraryGetProcAddr(layer_library, function_name));
            if (initLoader != nullptr) {
                // we found the entry point one way or another.
                LoaderLogger::LogInfoMessage(openxr_command,
                                             "ApiLayerInterface::LoadApiLayers forwarding xrInitializeLoaderKHR call to API layer "
                                             "before calling xrNegotiateLoaderApiLayerInterface.");
                XrResult res = initLoader(LoaderInitData::instance().getParam());
                if (!XR_SUCCEEDED(res)) {
                    LoaderLogger::LogErrorMessage(
                        openxr_command, "ApiLayerInterface::LoadApiLayers forwarded call to xrInitializeLoaderKHR failed.");

                    LoaderPlatformLibraryClose(layer_library);
                    return res;
                }
                forwardedInitLoader = true;
            }
        }
#endif

        // Get and settle on an layer interface version (using any provided name if required).
        std::string function_name = manifest_file->GetFunctionName("xrNegotiateLoaderApiLayerInterface");
        auto negotiate = reinterpret_cast<PFN_xrNegotiateLoaderApiLayerInterface>(
            LoaderPlatformLibraryGetProcAddr(layer_library, function_name));

        if (nullptr == negotiate) {
            std::ostringstream oss;
            oss << "ApiLayerInterface::LoadApiLayers skipping layer " << manifest_file->LayerName()
                << " because negotiation function " << function_name << " was not found";
            LoaderLogger::LogErrorMessage(openxr_command, oss.str());
            LoaderPlatformLibraryClose(layer_library);
            last_error = XR_ERROR_API_LAYER_NOT_PRESENT;
            continue;
        }

        // Loader info for negotiation
        XrNegotiateLoaderInfo loader_info = {};
        loader_info.structType = XR_LOADER_INTERFACE_STRUCT_LOADER_INFO;
        loader_info.structVersion = XR_LOADER_INFO_STRUCT_VERSION;
        loader_info.structSize = sizeof(XrNegotiateLoaderInfo);
        loader_info.minInterfaceVersion = 1;
        loader_info.maxInterfaceVersion = XR_CURRENT_LOADER_API_LAYER_VERSION;
        loader_info.minApiVersion = XR_MAKE_VERSION(1, 0, 0);
        loader_info.maxApiVersion = XR_MAKE_VERSION(1, 0x3ff, 0xfff);  // Maximum allowed version for this major version.

        // Set up the layer return structure
        XrNegotiateApiLayerRequest api_layer_info = {};
        api_layer_info.structType = XR_LOADER_INTERFACE_STRUCT_API_LAYER_REQUEST;
        api_layer_info.structVersion = XR_API_LAYER_INFO_STRUCT_VERSION;
        api_layer_info.structSize = sizeof(XrNegotiateApiLayerRequest);

        XrResult res = negotiate(&loader_info, manifest_file->LayerName().c_str(), &api_layer_info);
        // If we supposedly succeeded, but got a nullptr for getInstanceProcAddr
        // then something still went wrong, so return with an error.
        if (XR_SUCCEEDED(res) && nullptr == api_layer_info.getInstanceProcAddr) {
            std::string warning_message = "ApiLayerInterface::LoadApiLayers skipping layer ";
            warning_message += manifest_file->LayerName();
            warning_message += ", negotiation did not return a valid getInstanceProcAddr";
            LoaderLogger::LogWarningMessage(openxr_command, warning_message);
            res = XR_ERROR_FILE_CONTENTS_INVALID;
        }

#ifdef XR_KHR_LOADER_INIT_SUPPORT
        if (XR_SUCCEEDED(res) && !forwardedInitLoader) {
            // Forward initialize loader call, where possible and if we did not do so before.
            PFN_xrVoidFunction initializeVoid = nullptr;
            PFN_xrInitializeLoaderKHR initialize = nullptr;

            // Now we may try asking xrGetInstanceProcAddr on the API layer
            if (XR_SUCCEEDED(api_layer_info.getInstanceProcAddr(XR_NULL_HANDLE, "xrInitializeLoaderKHR", &initializeVoid))) {
                if (initializeVoid == nullptr) {
                    LoaderLogger::LogErrorMessage(openxr_command,
                                                  "ApiLayerInterface::LoadApiLayers got success from xrGetInstanceProcAddr "
                                                  "for xrInitializeLoaderKHR, but output a null pointer.");
                    res = XR_ERROR_RUNTIME_FAILURE;
                } else {
                    initialize = reinterpret_cast<PFN_xrInitializeLoaderKHR>(initializeVoid);
                }
            }
            if (initialize != nullptr) {
                // we found the entry point one way or another.
                LoaderLogger::LogInfoMessage(openxr_command,
                                             "ApiLayerInterface::LoadApiLayers forwarding xrInitializeLoaderKHR call to API layer "
                                             "after calling xrNegotiateLoaderApiLayerInterface.");
                res = initialize(LoaderInitData::instance().getParam());
                if (!XR_SUCCEEDED(res)) {
                    LoaderLogger::LogErrorMessage(
                        openxr_command, "ApiLayerInterface::LoadApiLayers forwarded call to xrInitializeLoaderKHR failed.");
                }
            }
        }
#endif

        if (XR_FAILED(res)) {
            if (!any_loaded) {
                last_error = res;
            }
            std::ostringstream oss;
            oss << "ApiLayerInterface::LoadApiLayers skipping layer " << manifest_file->LayerName()
                << " due to failed negotiation with error " << res;
            LoaderLogger::LogWarningMessage(openxr_command, oss.str());
            LoaderPlatformLibraryClose(layer_library);
            continue;
        }

        {
            std::ostringstream oss;
            oss << "ApiLayerInterface::LoadApiLayers succeeded loading layer " << manifest_file->LayerName()
                << " using interface version " << api_layer_info.layerInterfaceVersion << " and OpenXR API version "
                << XR_VERSION_MAJOR(api_layer_info.layerApiVersion) << "." << XR_VERSION_MINOR(api_layer_info.layerApiVersion);
            LoaderLogger::LogInfoMessage(openxr_command, oss.str());
        }

        // Grab the list of extensions this layer supports for easy filtering after the
        // xrCreateInstance call
        std::vector<std::string> supported_extensions;
        std::vector<XrExtensionProperties> extension_properties;
        manifest_file->GetInstanceExtensionProperties(extension_properties);
        supported_extensions.reserve(extension_properties.size());
        for (XrExtensionProperties& ext_prop : extension_properties) {
            supported_extensions.emplace_back(ext_prop.extensionName);
        }

        // Add this API layer to the vector
        api_layer_interfaces.emplace_back(new ApiLayerInterface(manifest_file->LayerName(), layer_library, supported_extensions,
                                                                api_layer_info.getInstanceProcAddr,
                                                                api_layer_info.createApiLayerInstance));

        // If we load one, clear all errors.
        any_loaded = true;
        last_error = XR_SUCCESS;
    }

    // Set error here to preserve prior error behavior
    if (!found_all_layers) {
        last_error = XR_ERROR_API_LAYER_NOT_PRESENT;
    }

    // If we failed catastrophically for some reason, clean up everything.
    if (XR_FAILED(last_error)) {
        api_layer_interfaces.clear();
    }

    return last_error;
}